

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O1

void __thiscall
AddrManImpl::Unserialize<HashVerifier<AutoFile>>(AddrManImpl *this,HashVerifier<AutoFile> *s_)

{
  uint256 *nKey;
  int *fmt;
  nid_type *__args;
  iterator __position;
  iterator __position_00;
  mapped_type mVar1;
  long lVar2;
  _Hash_node_base *p_Var3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  _Hash_node_base *p_Var6;
  pointer ppVar7;
  HashVerifier<AutoFile> *pHVar8;
  undefined8 uVar9;
  bool bVar10;
  bool bVar11;
  Network NVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  _Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false> __tmp;
  mapped_type *pmVar16;
  mapped_type *pmVar17;
  mapped_type *pmVar18;
  Logger *pLVar19;
  ulong uVar20;
  string *psVar21;
  SerParams *__nbytes;
  int *fmt_00;
  nid_type (*panVar22) [64];
  int *in_R8;
  long lVar23;
  pointer ppVar24;
  int iVar25;
  long in_FS_OFFSET;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  uchar *in_stack_fffffffffffffe38;
  int check_code;
  int nLostUnk;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> bucket_entries;
  int nLost;
  uint8_t lowest_compatible;
  uint8_t compat;
  ParamsStream<HashVerifier<AutoFile>_&,_CAddress::SerParams> s;
  SerParams ser_params;
  Format format;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock1;
  int entry_index;
  undefined4 uStack_114;
  uint256 serialized_asmap_checksum;
  uint256 supplied_asmap_checksum;
  uint16_t local_b8;
  NodeSeconds local_b0;
  ServiceFlags SStack_a8;
  NodeSeconds local_a0;
  NodeSeconds NStack_98;
  direct_or_indirect local_90;
  uint local_80;
  Network local_78;
  uint32_t uStack_74;
  NodeSeconds local_70;
  int aiStack_68 [2];
  bool local_60;
  undefined3 uStack_5f;
  int iStack_5c;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock1.super_unique_lock._M_owns = false;
  criticalblock1.super_unique_lock._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&criticalblock1.super_unique_lock);
  if ((this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __assert_fail("vRandom.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                  ,0xeb,"void AddrManImpl::Unserialize(Stream &) [Stream = HashVerifier<AutoFile>]")
    ;
  }
  supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_8_ = &format;
  Wrapper<CustomUintFormatter<1,false>,AddrManImpl::Format&>::Unserialize<HashVerifier<AutoFile>>
            ((Wrapper<CustomUintFormatter<1,false>,AddrManImpl::Format&> *)&supplied_asmap_checksum,
             s_);
  ser_params._1_7_ = 0;
  ser_params.super_SerParams.enc._0_1_ = V2_ASMAP < format;
  __nbytes = &ser_params;
  s.m_params = __nbytes;
  s.m_substream = s_;
  AutoFile::read(s_->m_source,(int)&supplied_asmap_checksum,(void *)0x1,(size_t)__nbytes);
  CSHA256::Write((CSHA256 *)s_,(uchar *)&supplied_asmap_checksum,1);
  pHVar8 = s.m_substream;
  compat = supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0];
  if (supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0] < 0x20) {
    psVar21 = (string *)__cxa_allocate_exception(0x20);
    tinyformat::format<unsigned_char,unsigned_char>
              ((string *)&supplied_asmap_checksum,
               (tinyformat *)
               "Corrupted addrman database: The compat value (%u) is lower than the expected minimum value %u."
               ,(char *)&compat,
               " /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/banman.cpp"
               ,(uchar *)in_R8);
    std::ios_base::failure[abi:cxx11]::failure(psVar21);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(psVar21,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  else {
    lowest_compatible = supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0] - 0x20;
    if (lowest_compatible < 5) {
      nKey = &this->nKey;
      AutoFile::read((s.m_substream)->m_source,(int)nKey,(void *)0x20,(size_t)__nbytes);
      CSHA256::Write((CSHA256 *)pHVar8,(uchar *)nKey,0x20);
      pHVar8 = s.m_substream;
      AutoFile::read((s.m_substream)->m_source,(int)&supplied_asmap_checksum,(void *)0x4,
                     (size_t)__nbytes);
      CSHA256::Write((CSHA256 *)pHVar8,(uchar *)&supplied_asmap_checksum,4);
      pHVar8 = s.m_substream;
      this->nNew = supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_4_;
      AutoFile::read((s.m_substream)->m_source,(int)&supplied_asmap_checksum,(void *)0x4,
                     (size_t)__nbytes);
      CSHA256::Write((CSHA256 *)pHVar8,(uchar *)&supplied_asmap_checksum,4);
      pHVar8 = s.m_substream;
      fmt_00 = &this->nTried;
      *fmt_00 = supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_4_;
      AutoFile::read((s.m_substream)->m_source,(int)&supplied_asmap_checksum,(void *)0x4,
                     (size_t)fmt_00);
      CSHA256::Write((CSHA256 *)pHVar8,(uchar *)&supplied_asmap_checksum,4);
      fmt = &this->nNew;
      uVar15 = supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_4_ ^ 0x40000000;
      if (format == V0_HISTORICAL) {
        uVar15 = supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_4_;
      }
      if ((uint)*fmt < 0x10001) {
        if ((uint)*fmt_00 < 0x4001) {
          iVar13 = *fmt;
          if (0 < iVar13) {
            lVar23 = 0;
            do {
              supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_8_ = lVar23;
              pmVar16 = std::__detail::
                        _Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&this->mapInfo,(key_type *)&supplied_asmap_checksum);
              supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_8_ =
                   &pmVar16->m_last_success;
              ActionUnserialize::
              SerReadWriteMany<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>,CAddress&,CNetAddr&,Wrapper<ChronoFormatter<long,false>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>,int&>
                        (&s,&pmVar16->super_CAddress,&pmVar16->source,
                         (Wrapper<ChronoFormatter<long,_false>,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_&>
                          *)&supplied_asmap_checksum,&pmVar16->nAttempts);
              pmVar17 = std::__detail::
                        _Map_base<CService,_std::pair<const_CService,_long>,_std::allocator<std::pair<const_CService,_long>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<CService,_std::pair<const_CService,_long>,_std::allocator<std::pair<const_CService,_long>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&this->mapAddr,(key_type *)pmVar16);
              *pmVar17 = lVar23;
              __position._M_current =
                   (this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              pmVar16->nRandomPos =
                   (int)((ulong)((long)__position._M_current -
                                (long)(this->vRandom).
                                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 3);
              if (__position._M_current ==
                  (this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_8_ = lVar23;
                std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                          (&this->vRandom,__position,(long *)&supplied_asmap_checksum);
              }
              else {
                *__position._M_current = lVar23;
                (this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish = __position._M_current + 1;
                supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_8_ = lVar23;
              }
              NVar12 = CNetAddr::GetNetwork((CNetAddr *)pmVar16);
              supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0] = (char)NVar12;
              supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[1] = (char)(NVar12 >> 8)
              ;
              supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[2] =
                   (char)(NVar12 >> 0x10);
              supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[3] =
                   (char)(NVar12 >> 0x18);
              pmVar18 = std::__detail::
                        _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&this->m_network_counts,(key_type *)&supplied_asmap_checksum
                                    );
              pmVar18->n_new = pmVar18->n_new + 1;
              lVar23 = lVar23 + 1;
              iVar13 = *fmt;
            } while (lVar23 < iVar13);
          }
          this->nIdCount = (long)iVar13;
          nLost = 0;
          iVar13 = this->nTried;
          if (0 < iVar13) {
            __args = &this->nIdCount;
            iVar25 = 0;
            do {
              AddrInfo::AddrInfo((AddrInfo *)&supplied_asmap_checksum);
              serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_8_ = &local_70;
              ActionUnserialize::
              SerReadWriteMany<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>,CAddress&,CNetAddr&,Wrapper<ChronoFormatter<long,false>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>,int&>
                        (&s,(CAddress *)&supplied_asmap_checksum,
                         (CNetAddr *)&local_90.indirect_contents,
                         (Wrapper<ChronoFormatter<long,_false>,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_&>
                          *)&serialized_asmap_checksum,aiStack_68);
              iVar13 = AddrInfo::GetTriedBucket
                                 ((AddrInfo *)&supplied_asmap_checksum,nKey,this->m_netgroupman);
              uVar14 = AddrInfo::GetBucketPosition
                                 ((AddrInfo *)&supplied_asmap_checksum,nKey,false,iVar13);
              bVar10 = CNetAddr::IsValid((CNetAddr *)&supplied_asmap_checksum);
              if (bVar10) {
                lVar23 = (ulong)(uint)(iVar13 << 9) + 0x178;
                if (*(long *)((long)this->vvTried[0] + (ulong)uVar14 * 8 + lVar23 + -0x178) != -1)
                goto LAB_0086383f;
                __position_00._M_current =
                     (this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                iStack_5c = (int)((ulong)((long)__position_00._M_current -
                                         (long)(this->vRandom).
                                               super__Vector_base<long,_std::allocator<long>_>.
                                               _M_impl.super__Vector_impl_data._M_start) >> 3);
                local_60 = true;
                if (__position_00._M_current ==
                    (this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                            ((vector<long,std::allocator<long>> *)&this->vRandom,__position_00,
                             __args);
                }
                else {
                  *__position_00._M_current = this->nIdCount;
                  (this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish = __position_00._M_current + 1;
                }
                pmVar16 = std::__detail::
                          _Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)&this->mapInfo,__args);
                prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
                          ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)pmVar16,
                           (prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                           &supplied_asmap_checksum);
                uVar4 = CONCAT13(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x1b]
                                 ,CONCAT12(supplied_asmap_checksum.super_base_blob<256U>.m_data.
                                           _M_elems[0x1a],
                                           CONCAT11(supplied_asmap_checksum.super_base_blob<256U>.
                                                    m_data._M_elems[0x19],
                                                    supplied_asmap_checksum.super_base_blob<256U>.
                                                    m_data._M_elems[0x18])));
                (pmVar16->super_CAddress).super_CService.super_CNetAddr.m_net = uVar4;
                (pmVar16->super_CAddress).super_CService.super_CNetAddr.m_scope_id =
                     (int)(CONCAT17(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems
                                    [0x1f],CONCAT16(supplied_asmap_checksum.super_base_blob<256U>.
                                                    m_data._M_elems[0x1e],
                                                    CONCAT15(supplied_asmap_checksum.
                                                             super_base_blob<256U>.m_data._M_elems
                                                             [0x1d],CONCAT14(supplied_asmap_checksum
                                                                             .super_base_blob<256U>.
                                                                             m_data._M_elems[0x1c],
                                                                             uVar4)))) >> 0x20);
                (pmVar16->super_CAddress).super_CService.port = local_b8;
                (pmVar16->super_CAddress).nTime.__d.__r = (rep)local_b0.__d.__r;
                (pmVar16->super_CAddress).nServices = SStack_a8;
                (pmVar16->m_last_try).__d.__r = (rep)local_a0.__d.__r;
                (pmVar16->m_last_count_attempt).__d.__r = (rep)NStack_98.__d.__r;
                prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
                          (&(pmVar16->source).m_addr,
                           (prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                           &local_90.indirect_contents);
                (pmVar16->source).m_net = local_78;
                (pmVar16->source).m_scope_id = uStack_74;
                (pmVar16->m_last_success).__d.__r = (rep)local_70.__d.__r;
                pmVar16->nAttempts = aiStack_68[0];
                pmVar16->nRefCount = aiStack_68[1];
                pmVar16->fInTried = (bool)(char)_local_60;
                *(int3 *)&pmVar16->field_0x79 = SUB43(_local_60,1);
                pmVar16->nRandomPos = iStack_5c;
                mVar1 = *__args;
                pmVar17 = std::__detail::
                          _Map_base<CService,_std::pair<const_CService,_long>,_std::allocator<std::pair<const_CService,_long>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<CService,_std::pair<const_CService,_long>,_std::allocator<std::pair<const_CService,_long>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)&this->mapAddr,(key_type *)&supplied_asmap_checksum);
                *pmVar17 = mVar1;
                lVar2 = *__args;
                *(long *)((long)this->vvTried[0] + (ulong)uVar14 * 8 + lVar23 + -0x178) = lVar2;
                *__args = lVar2 + 1;
                NVar12 = CNetAddr::GetNetwork((CNetAddr *)&supplied_asmap_checksum);
                serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0] = (char)NVar12;
                serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[1] =
                     (char)(NVar12 >> 8);
                serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[2] =
                     (char)(NVar12 >> 0x10);
                serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[3] =
                     (char)(NVar12 >> 0x18);
                pmVar18 = std::__detail::
                          _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)&this->m_network_counts,
                                       (key_type *)&serialized_asmap_checksum);
                pmVar18->n_tried = pmVar18->n_tried + 1;
              }
              else {
LAB_0086383f:
                nLost = nLost + 1;
              }
              if (0x10 < local_80) {
                free(local_90.indirect_contents.indirect);
                local_90.indirect_contents.indirect = (char *)0x0;
              }
              if (0x10 < (uint)supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems._16_4_)
              {
                free((void *)supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_8_);
                supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0] = '\0';
                supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[1] = '\0';
                supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[2] = '\0';
                supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[3] = '\0';
                supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[4] = '\0';
                supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[5] = '\0';
                supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[6] = '\0';
                supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[7] = '\0';
              }
              iVar25 = iVar25 + 1;
              iVar13 = *fmt_00;
            } while (iVar25 < iVar13);
          }
          *fmt_00 = iVar13 - nLost;
          bucket_entries.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          bucket_entries.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          bucket_entries.
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          auVar5._12_4_ = 0;
          auVar5[0] = serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[4];
          auVar5[1] = serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[5];
          auVar5[2] = serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[6];
          auVar5[3] = serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[7];
          auVar5[4] = serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[8];
          auVar5[5] = serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[9];
          auVar5[6] = serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[10];
          auVar5[7] = serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0xb];
          auVar5[8] = serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0xc];
          auVar5[9] = serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0xd];
          auVar5[10] = serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0xe];
          auVar5[0xb] = serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0xf];
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_16_ = auVar5 << 0x20;
          if (0 < (int)uVar15) {
            do {
              pHVar8 = s.m_substream;
              iVar25 = (int)&supplied_asmap_checksum;
              AutoFile::read((s.m_substream)->m_source,iVar25,(void *)0x4,(size_t)fmt_00);
              CSHA256::Write((CSHA256 *)pHVar8,(uchar *)&supplied_asmap_checksum,4);
              iVar13 = supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_4_;
              if (0 < (int)supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_4_) {
                do {
                  pHVar8 = s.m_substream;
                  _entry_index = _entry_index & 0xffffffff00000000;
                  AutoFile::read((s.m_substream)->m_source,iVar25,(void *)0x4,(size_t)fmt_00);
                  CSHA256::Write((CSHA256 *)pHVar8,(uchar *)&supplied_asmap_checksum,4);
                  uVar9 = supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_8_;
                  entry_index._0_1_ =
                       supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0];
                  entry_index._1_1_ =
                       supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[1];
                  entry_index._2_1_ =
                       supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[2];
                  entry_index._3_1_ =
                       supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[3];
                  if ((-1 < (int)supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_4_
                      ) && (fmt_00 = fmt,
                           (int)supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_4_
                           < *fmt)) {
                    supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_8_ = uVar9;
                    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                    emplace_back<int&,int&>
                              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                               &bucket_entries,(int *)&serialized_asmap_checksum,&entry_index);
                    uVar9 = supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_8_;
                  }
                  supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_8_ = uVar9;
                  iVar13 = iVar13 + -1;
                } while (iVar13 != 0);
              }
              iVar13 = serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_4_ + 1;
              serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_4_ = iVar13;
            } while (iVar13 < (int)uVar15);
          }
          NetGroupManager::GetAsmapChecksum(&supplied_asmap_checksum,this->m_netgroupman);
          pHVar8 = s.m_substream;
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0] = '\0';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[1] = '\0';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[2] = '\0';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[3] = '\0';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[4] = '\0';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[5] = '\0';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[6] = '\0';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[7] = '\0';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[8] = '\0';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[9] = '\0';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[10] = '\0';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
          if (V1_DETERMINISTIC < format) {
            AutoFile::read((s.m_substream)->m_source,(int)&serialized_asmap_checksum,(void *)0x20,
                           (size_t)fmt_00);
            CSHA256::Write((CSHA256 *)pHVar8,(uchar *)&serialized_asmap_checksum,0x20);
          }
          if (uVar15 == 0x400) {
            auVar27[0] = -(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x10] ==
                          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x10]);
            auVar27[1] = -(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x11] ==
                          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x11]);
            auVar27[2] = -(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x12] ==
                          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x12]);
            auVar27[3] = -(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x13] ==
                          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x13]);
            auVar27[4] = -(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x14] ==
                          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x14]);
            auVar27[5] = -(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x15] ==
                          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x15]);
            auVar27[6] = -(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x16] ==
                          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x16]);
            auVar27[7] = -(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x17] ==
                          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x17]);
            auVar27[8] = -(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x18] ==
                          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x18]);
            auVar27[9] = -(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x19] ==
                          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x19]);
            auVar27[10] = -(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                           serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x1a]);
            auVar27[0xb] = -(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                            serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x1b]);
            auVar27[0xc] = -(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                            serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x1c]);
            auVar27[0xd] = -(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                            serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x1d]);
            auVar27[0xe] = -(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                            serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x1e]);
            auVar27[0xf] = -(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                            serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x1f]);
            auVar26[0] = -(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0] ==
                          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0]);
            auVar26[1] = -(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[1] ==
                          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[1]);
            auVar26[2] = -(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[2] ==
                          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[2]);
            auVar26[3] = -(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[3] ==
                          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[3]);
            auVar26[4] = -(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[4] ==
                          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[4]);
            auVar26[5] = -(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[5] ==
                          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[5]);
            auVar26[6] = -(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[6] ==
                          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[6]);
            auVar26[7] = -(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[7] ==
                          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[7]);
            auVar26[8] = -(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[8] ==
                          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[8]);
            auVar26[9] = -(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[9] ==
                          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[9]);
            auVar26[10] = -(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[10] ==
                           serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[10]);
            auVar26[0xb] = -(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0xb] ==
                            serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0xb]);
            auVar26[0xc] = -(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0xc] ==
                            serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0xc]);
            auVar26[0xd] = -(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0xd] ==
                            serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0xd]);
            auVar26[0xe] = -(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0xe] ==
                            serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0xe]);
            auVar26[0xf] = -(supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0xf] ==
                            serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0xf]);
            auVar26 = auVar26 & auVar27;
            bVar10 = (ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                             (ushort)(byte)(auVar26[0xf] >> 7) << 0xf) == 0xffff;
          }
          else {
            bVar10 = false;
          }
          if (!bVar10) {
            pLVar19 = LogInstance();
            bVar11 = BCLog::Logger::WillLogCategoryLevel(pLVar19,ADDRMAN,Debug);
            if (bVar11) {
              source_file._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
              ;
              source_file._M_len = 0x5b;
              logging_function._M_str = "Unserialize";
              logging_function._M_len = 0xb;
              LogPrintFormatInternal<>
                        (logging_function,source_file,0x159,ADDRMAN,Debug,
                         (ConstevalFormatString<0U>)0xf8f5eb);
            }
          }
          ppVar7 = bucket_entries.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          if (bucket_entries.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start !=
              bucket_entries.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_finish) {
            ppVar24 = bucket_entries.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              iVar13 = ppVar24->first;
              iVar25 = ppVar24->second;
              _entry_index = (pointer)(long)iVar25;
              pmVar16 = std::__detail::
                        _Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&this->mapInfo,(key_type *)&entry_index);
              bVar11 = CNetAddr::IsValid((CNetAddr *)pmVar16);
              if ((bVar11) && (pmVar16->nRefCount < 8)) {
                uVar15 = AddrInfo::GetBucketPosition(pmVar16,nKey,true,iVar13);
                if (bVar10) {
                  panVar22 = this->vvNew + iVar13;
                  uVar20 = (ulong)uVar15;
                  if ((*panVar22)[uVar20] != -1) goto LAB_00863c78;
                }
                else {
LAB_00863c78:
                  iVar13 = AddrInfo::GetNewBucket(pmVar16,nKey,&pmVar16->source,this->m_netgroupman)
                  ;
                  uVar15 = AddrInfo::GetBucketPosition(pmVar16,nKey,true,iVar13);
                  panVar22 = (nid_type (*) [64])((long)this->vvNew[0] + (ulong)(uint)(iVar13 << 9));
                  uVar20 = (ulong)uVar15;
                  if ((*panVar22)[uVar20] != -1) goto LAB_00863cca;
                }
                (*panVar22)[uVar20] = (nid_type)(long)iVar25;
                pmVar16->nRefCount = pmVar16->nRefCount + 1;
              }
LAB_00863cca:
              ppVar24 = ppVar24 + 1;
            } while (ppVar24 != ppVar7);
          }
          nLostUnk = 0;
          p_Var6 = (this->mapInfo)._M_h._M_before_begin._M_nxt;
          while (p_Var6 != (_Hash_node_base *)0x0) {
            if ((*(char *)&p_Var6[0x11]._M_nxt == '\0') &&
               (*(int *)((long)&p_Var6[0x10]._M_nxt + 4) == 0)) {
              p_Var3 = p_Var6->_M_nxt;
              Delete(this,(nid_type)p_Var6[1]._M_nxt);
              nLostUnk = nLostUnk + 1;
              p_Var6 = p_Var3;
            }
            else {
              p_Var6 = p_Var6->_M_nxt;
            }
          }
          if (nLostUnk + nLost != 0 && SCARRY4(nLostUnk,nLost) == nLostUnk + nLost < 0) {
            pLVar19 = LogInstance();
            bVar10 = BCLog::Logger::WillLogCategoryLevel(pLVar19,ADDRMAN,Debug);
            if (bVar10) {
              source_file_00._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
              ;
              source_file_00._M_len = 0x5b;
              logging_function_00._M_str = "Unserialize";
              logging_function_00._M_len = 0xb;
              LogPrintFormatInternal<int,int>
                        (logging_function_00,source_file_00,0x186,ADDRMAN,Debug,
                         (ConstevalFormatString<2U>)0xf8f631,&nLostUnk,&nLost);
            }
          }
          check_code = CheckAddrman(this);
          if (check_code == 0) {
            if (bucket_entries.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(bucket_entries.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)bucket_entries.
                                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)bucket_entries.
                                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            std::unique_lock<std::mutex>::~unique_lock(&criticalblock1.super_unique_lock);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              return;
            }
          }
          else {
            psVar21 = (string *)__cxa_allocate_exception(0x20);
            tinyformat::format<int>
                      ((string *)&entry_index,"Corrupt data. Consistency check failed with code %s",
                       &check_code);
            std::ios_base::failure[abi:cxx11]::failure(psVar21);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(psVar21,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
          }
        }
        else {
          psVar21 = (string *)__cxa_allocate_exception(0x20);
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0] = '\0';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[1] = '@';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[2] = '\0';
          serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[3] = '\0';
          tinyformat::format<int,int>
                    ((string *)&supplied_asmap_checksum,
                     (tinyformat *)"Corrupt AddrMan serialization: nTried=%d, should be in [0, %d]",
                     (char *)fmt_00,(int *)&serialized_asmap_checksum,in_R8);
          std::ios_base::failure[abi:cxx11]::failure(psVar21);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(psVar21,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
        }
      }
      else {
        psVar21 = (string *)__cxa_allocate_exception(0x20);
        serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0] = '\0';
        serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[2] = '\x01';
        serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        tinyformat::format<int,int>
                  ((string *)&supplied_asmap_checksum,
                   (tinyformat *)"Corrupt AddrMan serialization: nNew=%d, should be in [0, %d]",
                   (char *)fmt,(int *)&serialized_asmap_checksum,in_R8);
        std::ios_base::failure[abi:cxx11]::failure(psVar21);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(psVar21,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
    }
    else {
      psVar21 = (string *)__cxa_allocate_exception(0x20);
      supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0] = format;
      serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0] = '\x04';
      tinyformat::format<unsigned_char,unsigned_char,char[13],unsigned_char>
                (&local_58,
                 (tinyformat *)
                 "Unsupported format of addrman database: %u. It is compatible with formats >=%u, but the maximum supported by this version of %s is %u."
                 ,(char *)&supplied_asmap_checksum,&lowest_compatible,(uchar *)"Bitcoin Core",
                 (char (*) [13])&serialized_asmap_checksum,in_stack_fffffffffffffe38);
      std::ios_base::failure[abi:cxx11]::failure(psVar21);
      *(undefined ***)psVar21 = &PTR__failure_013b35a0;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(psVar21,&InvalidAddrManVersionError::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

void AddrManImpl::Unserialize(Stream& s_)
{
    LOCK(cs);

    assert(vRandom.empty());

    Format format;
    s_ >> Using<CustomUintFormatter<1>>(format);

    const auto ser_params = (format >= Format::V3_BIP155 ? CAddress::V2_DISK : CAddress::V1_DISK);
    ParamsStream s{s_, ser_params};

    uint8_t compat;
    s >> compat;
    if (compat < INCOMPATIBILITY_BASE) {
        throw std::ios_base::failure(strprintf(
            "Corrupted addrman database: The compat value (%u) "
            "is lower than the expected minimum value %u.",
            compat, INCOMPATIBILITY_BASE));
    }
    const uint8_t lowest_compatible = compat - INCOMPATIBILITY_BASE;
    if (lowest_compatible > FILE_FORMAT) {
        throw InvalidAddrManVersionError(strprintf(
            "Unsupported format of addrman database: %u. It is compatible with formats >=%u, "
            "but the maximum supported by this version of %s is %u.",
            uint8_t{format}, lowest_compatible, PACKAGE_NAME, uint8_t{FILE_FORMAT}));
    }

    s >> nKey;
    s >> nNew;
    s >> nTried;
    int nUBuckets = 0;
    s >> nUBuckets;
    if (format >= Format::V1_DETERMINISTIC) {
        nUBuckets ^= (1 << 30);
    }

    if (nNew > ADDRMAN_NEW_BUCKET_COUNT * ADDRMAN_BUCKET_SIZE || nNew < 0) {
        throw std::ios_base::failure(
                strprintf("Corrupt AddrMan serialization: nNew=%d, should be in [0, %d]",
                    nNew,
                    ADDRMAN_NEW_BUCKET_COUNT * ADDRMAN_BUCKET_SIZE));
    }

    if (nTried > ADDRMAN_TRIED_BUCKET_COUNT * ADDRMAN_BUCKET_SIZE || nTried < 0) {
        throw std::ios_base::failure(
                strprintf("Corrupt AddrMan serialization: nTried=%d, should be in [0, %d]",
                    nTried,
                    ADDRMAN_TRIED_BUCKET_COUNT * ADDRMAN_BUCKET_SIZE));
    }

    // Deserialize entries from the new table.
    for (int n = 0; n < nNew; n++) {
        AddrInfo& info = mapInfo[n];
        s >> info;
        mapAddr[info] = n;
        info.nRandomPos = vRandom.size();
        vRandom.push_back(n);
        m_network_counts[info.GetNetwork()].n_new++;
    }
    nIdCount = nNew;

    // Deserialize entries from the tried table.
    int nLost = 0;
    for (int n = 0; n < nTried; n++) {
        AddrInfo info;
        s >> info;
        int nKBucket = info.GetTriedBucket(nKey, m_netgroupman);
        int nKBucketPos = info.GetBucketPosition(nKey, false, nKBucket);
        if (info.IsValid()
                && vvTried[nKBucket][nKBucketPos] == -1) {
            info.nRandomPos = vRandom.size();
            info.fInTried = true;
            vRandom.push_back(nIdCount);
            mapInfo[nIdCount] = info;
            mapAddr[info] = nIdCount;
            vvTried[nKBucket][nKBucketPos] = nIdCount;
            nIdCount++;
            m_network_counts[info.GetNetwork()].n_tried++;
        } else {
            nLost++;
        }
    }
    nTried -= nLost;

    // Store positions in the new table buckets to apply later (if possible).
    // An entry may appear in up to ADDRMAN_NEW_BUCKETS_PER_ADDRESS buckets,
    // so we store all bucket-entry_index pairs to iterate through later.
    std::vector<std::pair<int, int>> bucket_entries;

    for (int bucket = 0; bucket < nUBuckets; ++bucket) {
        int num_entries{0};
        s >> num_entries;
        for (int n = 0; n < num_entries; ++n) {
            int entry_index{0};
            s >> entry_index;
            if (entry_index >= 0 && entry_index < nNew) {
                bucket_entries.emplace_back(bucket, entry_index);
            }
        }
    }

    // If the bucket count and asmap checksum haven't changed, then attempt
    // to restore the entries to the buckets/positions they were in before
    // serialization.
    uint256 supplied_asmap_checksum{m_netgroupman.GetAsmapChecksum()};
    uint256 serialized_asmap_checksum;
    if (format >= Format::V2_ASMAP) {
        s >> serialized_asmap_checksum;
    }
    const bool restore_bucketing{nUBuckets == ADDRMAN_NEW_BUCKET_COUNT &&
        serialized_asmap_checksum == supplied_asmap_checksum};

    if (!restore_bucketing) {
        LogDebug(BCLog::ADDRMAN, "Bucketing method was updated, re-bucketing addrman entries from disk\n");
    }

    for (auto bucket_entry : bucket_entries) {
        int bucket{bucket_entry.first};
        const int entry_index{bucket_entry.second};
        AddrInfo& info = mapInfo[entry_index];

        // Don't store the entry in the new bucket if it's not a valid address for our addrman
        if (!info.IsValid()) continue;

        // The entry shouldn't appear in more than
        // ADDRMAN_NEW_BUCKETS_PER_ADDRESS. If it has already, just skip
        // this bucket_entry.
        if (info.nRefCount >= ADDRMAN_NEW_BUCKETS_PER_ADDRESS) continue;

        int bucket_position = info.GetBucketPosition(nKey, true, bucket);
        if (restore_bucketing && vvNew[bucket][bucket_position] == -1) {
            // Bucketing has not changed, using existing bucket positions for the new table
            vvNew[bucket][bucket_position] = entry_index;
            ++info.nRefCount;
        } else {
            // In case the new table data cannot be used (bucket count wrong or new asmap),
            // try to give them a reference based on their primary source address.
            bucket = info.GetNewBucket(nKey, m_netgroupman);
            bucket_position = info.GetBucketPosition(nKey, true, bucket);
            if (vvNew[bucket][bucket_position] == -1) {
                vvNew[bucket][bucket_position] = entry_index;
                ++info.nRefCount;
            }
        }
    }

    // Prune new entries with refcount 0 (as a result of collisions or invalid address).
    int nLostUnk = 0;
    for (auto it = mapInfo.cbegin(); it != mapInfo.cend(); ) {
        if (it->second.fInTried == false && it->second.nRefCount == 0) {
            const auto itCopy = it++;
            Delete(itCopy->first);
            ++nLostUnk;
        } else {
            ++it;
        }
    }
    if (nLost + nLostUnk > 0) {
        LogDebug(BCLog::ADDRMAN, "addrman lost %i new and %i tried addresses due to collisions or invalid addresses\n", nLostUnk, nLost);
    }

    const int check_code{CheckAddrman()};
    if (check_code != 0) {
        throw std::ios_base::failure(strprintf(
            "Corrupt data. Consistency check failed with code %s",
            check_code));
    }
}